

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_element_access_front_back_Test::TestBody
          (VectorSUnitTest_element_access_front_back_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  const_reference pvVar4;
  AssertHelper local_140;
  Message local_138;
  uint local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110;
  uint local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  initializer_list<unsigned_int> local_e0;
  undefined1 local_d0 [8];
  vector_s<unsigned_int,_4UL> vc;
  Message local_a8;
  uint local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  uint local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  initializer_list<unsigned_int> local_40;
  undefined1 local_30 [8];
  vector_s<unsigned_int,_4UL> v;
  VectorSUnitTest_element_access_front_back_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 2;
  local_40._M_array = (iterator)&gtest_ar.message_;
  local_40._M_len = 4;
  v.data_ptr_ = (pointer)this;
  estl::vector_s<unsigned_int,_4UL>::vector_s((vector_s<unsigned_int,_4UL> *)local_30,&local_40);
  local_64 = 1;
  pvVar2 = estl::vector_s<unsigned_int,_4UL>::front((vector_s<unsigned_int,_4UL> *)local_30);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_60,"1u","v.front()",&local_64,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x178,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_9c = 4;
  pvVar2 = estl::vector_s<unsigned_int,_4UL>::back((vector_s<unsigned_int,_4UL> *)local_30);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_98,"4u","v.back()",&local_9c,pvVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vc.data_ptr_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x179,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vc.data_ptr_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vc.data_ptr_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 2;
  local_e0._M_array = (iterator)&gtest_ar_2.message_;
  local_e0._M_len = 4;
  estl::vector_s<unsigned_int,_4UL>::vector_s((vector_s<unsigned_int,_4UL> *)local_d0,&local_e0);
  local_104 = 1;
  pvVar4 = estl::vector_s<unsigned_int,_4UL>::front((vector_s<unsigned_int,_4UL> *)local_d0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_100,"1u","vc.front()",&local_104,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x17d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_12c = 4;
  pvVar4 = estl::vector_s<unsigned_int,_4UL>::back((vector_s<unsigned_int,_4UL> *)local_d0);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_128,"4u","vc.back()",&local_12c,pvVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  estl::vector_s<unsigned_int,_4UL>::~vector_s((vector_s<unsigned_int,_4UL> *)local_d0);
  estl::vector_s<unsigned_int,_4UL>::~vector_s((vector_s<unsigned_int,_4UL> *)local_30);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, element_access_front_back)
{
    vector_s<unsigned, 4> v{1u,2u,3u,4u};
    EXPECT_EQ(1u, v.front());
    EXPECT_EQ(4u, v.back());

    // const variant of front()/back()
    const vector_s<unsigned, 4> vc{1u,2u,3u,4u};
    EXPECT_EQ(1u, vc.front());
    EXPECT_EQ(4u, vc.back());
}